

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmHeadToLinkInterfaceMap * __thiscall
cmGeneratorTarget::GetHeadToLinkInterfaceUsageRequirementsMap
          (cmGeneratorTarget *this,string *config)

{
  mapped_type *pmVar1;
  string local_38;
  string *local_18;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_18 = config;
  config_local = (string *)this;
  cmsys::SystemTools::UpperCase(&local_38,config);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmHeadToLinkInterfaceMap>_>_>
           ::operator[](&this->LinkInterfaceUsageRequirementsOnlyMap,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return pmVar1;
}

Assistant:

cmHeadToLinkInterfaceMap&
cmGeneratorTarget::GetHeadToLinkInterfaceUsageRequirementsMap(
  const std::string& config) const
{
  return this
    ->LinkInterfaceUsageRequirementsOnlyMap[cmSystemTools::UpperCase(config)];
}